

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

int __thiscall
icu_63::Locale::clone(Locale *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Locale *this_00;
  undefined8 local_30;
  Locale *this_local;
  
  this_00 = (Locale *)UMemory::operator_new((UMemory *)0xe0,(size_t)__fn);
  local_30 = (Locale *)0x0;
  if (this_00 != (Locale *)0x0) {
    Locale(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Locale *
Locale::clone() const {
    return new Locale(*this);
}